

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O1

bool __thiscall duckdb::Hugeint::TryCast<float>(Hugeint *this,hugeint_t input,float *result)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  if (input.lower == 0xffffffffffffffff) {
    uVar1 = ~(ulong)this;
    auVar3._8_4_ = (int)(uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._12_4_ = 0x45300000;
    dVar2 = -1.0 - ((auVar3._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
  }
  else {
    auVar4._8_4_ = (int)((ulong)this >> 0x20);
    auVar4._0_8_ = this;
    auVar4._12_4_ = 0x45300000;
    dVar2 = (double)(long)input.lower * 1.8446744073709552e+19 +
            (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this) - 4503599627370496.0);
  }
  *(float *)input.upper = (float)dVar2;
  return true;
}

Assistant:

bool CastBigintToFloating(hugeint_t input, REAL_T &result) {
	switch (input.upper) {
	case -1:
		// special case for upper = -1 to avoid rounding issues in small negative numbers
		result = -REAL_T(NumericLimits<uint64_t>::Maximum() - input.lower) - 1;
		break;
	default:
		result = REAL_T(input.lower) + REAL_T(input.upper) * (REAL_T(NumericLimits<uint64_t>::Maximum()) + 1);
		break;
	}
	return true;
}